

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_progress.c
# Opt level: O1

int zip_register_progress_callback_with_state
              (zip_t *za,double precision,zip_progress_callback callback,
              _func_void_void_ptr *ud_free,void *ud)

{
  zip_progress_t *pzVar1;
  
  pzVar1 = za->progress;
  if (callback == (zip_progress_callback)0x0) {
    if (pzVar1 != (zip_progress_t *)0x0) {
      if (pzVar1->callback_cancel == (zip_cancel_callback)0x0) {
        _zip_progress_free(pzVar1);
        za->progress = (zip_progress_t *)0x0;
      }
      else {
        if (pzVar1->ud_progress_free != (_func_void_void_ptr *)0x0) {
          (*pzVar1->ud_progress_free)(pzVar1->ud_progress);
        }
        pzVar1->callback_progress = (zip_progress_callback)0x0;
        pzVar1->ud_progress_free = (_func_void_void_ptr *)0x0;
        pzVar1->ud_progress = (void *)0x0;
      }
    }
  }
  else {
    if (pzVar1 == (zip_progress_t *)0x0) {
      pzVar1 = _zip_progress_new(za);
      za->progress = pzVar1;
      if (pzVar1 == (zip_progress_t *)0x0) {
        return -1;
      }
    }
    pzVar1 = za->progress;
    if (pzVar1->ud_progress_free != (_func_void_void_ptr *)0x0) {
      (*pzVar1->ud_progress_free)(pzVar1->ud_progress);
    }
    pzVar1->callback_progress = (zip_progress_callback)0x0;
    pzVar1->ud_progress_free = (_func_void_void_ptr *)0x0;
    pzVar1->callback_progress = callback;
    pzVar1->ud_progress_free = ud_free;
    pzVar1->ud_progress = ud;
    pzVar1->precision = precision;
  }
  return 0;
}

Assistant:

ZIP_EXTERN int
zip_register_progress_callback_with_state(zip_t *za, double precision, zip_progress_callback callback, void (*ud_free)(void *), void *ud) {
    if (callback != NULL) {
        if (za->progress == NULL) {
            if ((za->progress = _zip_progress_new(za)) == NULL) {
                return -1;
            }
        }

        _zip_progress_set_progress_callback(za->progress, precision, callback, ud_free, ud);
    }
    else {
        if (za->progress != NULL) {
            if (za->progress->callback_cancel == NULL) {
                _zip_progress_free(za->progress);
                za->progress = NULL;
            }
            else {
                _zip_progress_free_progress_callback(za->progress);
            }
        }
    }

    return 0;
}